

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shrinkStress.cpp
# Opt level: O0

void shrinkStress<1ul,1ul,unsigned_int,1ul,20ul,20ul,(char)48,(char)49>(uint32_t seed)

{
  KV randKV;
  size_t step;
  size_t iter;
  anon_class_8_1_10d00a46 checkNewIndex;
  anon_class_24_3_3cda8c2f checkStorage;
  anon_class_16_2_b0a10a34 checkSorted;
  anon_class_16_2_fd180e1f checkNotSorted;
  anon_class_16_2_b8051694 shrinkExpected;
  anon_class_8_1_a0093f41 appendToExpected;
  vector<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
  expectedSortedStorage;
  vector<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
  expectedNotSortedStorage;
  anon_class_8_1_8990f923 randKey;
  anon_class_8_1_8990f923 randValue;
  mt19937 rand;
  KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_int,_void>
  storage;
  shared_ptr<supermap::io::FileManager> manager;
  string NEW_INDEX_FILENAME;
  KV *in_stack_ffffffffffffe998;
  undefined7 in_stack_ffffffffffffe9a0;
  array<unsigned_char,_1UL> in_stack_ffffffffffffe9a7;
  KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_> *this;
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>_()>
  *this_00;
  KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_> *elem;
  OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
  *this_01;
  allocator<char> *__a;
  char *in_stack_ffffffffffffe9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe9e0;
  anon_class_8_1_8990f923 *in_stack_ffffffffffffe9e8;
  anon_class_16_2_b8051694 *this_02;
  ulong local_15b8;
  InnerRegisterSupplier *in_stack_ffffffffffffeae0;
  shared_ptr<supermap::io::FileManager> *in_stack_ffffffffffffeae8;
  string *in_stack_ffffffffffffeaf0;
  string *in_stack_ffffffffffffeaf8;
  KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_int,_void>
  *in_stack_ffffffffffffeb00;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
  *in_stack_ffffffffffffeb88;
  anon_class_8_1_10d00a46 *in_stack_ffffffffffffeb90;
  anon_class_24_3_3cda8c2f *in_stack_ffffffffffffecd0;
  string *in_stack_ffffffffffffedb8;
  uint in_stack_ffffffffffffedc4;
  KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_int,_void>
  *in_stack_ffffffffffffedc8;
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>_()>
  local_188;
  KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_> local_168;
  undefined1 local_151 [40];
  allocator<char> local_129;
  string local_128 [200];
  OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
  local_60;
  allocator<char> local_29;
  string local_28 [40];
  
  __a = &local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9d8,__a);
  std::allocator<char>::~allocator(&local_29);
  std::make_shared<supermap::io::DiskFileManager>();
  this_01 = &local_60;
  std::shared_ptr<supermap::io::FileManager>::shared_ptr<supermap::io::DiskFileManager,void>
            ((shared_ptr<supermap::io::FileManager> *)
             CONCAT17(in_stack_ffffffffffffe9a7._M_elems[0],in_stack_ffffffffffffe9a0),
             (shared_ptr<supermap::io::DiskFileManager> *)in_stack_ffffffffffffe998);
  std::shared_ptr<supermap::io::DiskFileManager>::~shared_ptr
            ((shared_ptr<supermap::io::DiskFileManager> *)0x1c2d5b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9d8,__a);
  elem = (KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_> *)local_151;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9d8,__a);
  this = &local_168;
  std::shared_ptr<supermap::io::FileManager>::shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)
             CONCAT17(in_stack_ffffffffffffe9a7._M_elems[0],in_stack_ffffffffffffe9a0),
             (shared_ptr<supermap::io::FileManager> *)in_stack_ffffffffffffe998);
  this_00 = &local_188;
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,void>,std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1ul>,unsigned_int>,void>>>()>
  ::
  function<shrinkStress<1ul,1ul,unsigned_int,1ul,20ul,20ul,(char)48,(char)49>(unsigned_int)::_lambda()_1_,void>
            (this_00,(anon_class_1_0_00000001 *)this);
  supermap::
  KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_int,_void>::
  KeyValueShrinkableStorage
            (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,in_stack_ffffffffffffeaf0,
             in_stack_ffffffffffffeae8,in_stack_ffffffffffffeae0);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>_()>
  ::~function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_void>_>_>_()>
               *)0x1c2e1f);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x1c2e2c);
  std::__cxx11::string::~string((string *)(local_151 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_151);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)CONCAT17(in_stack_ffffffffffffe9a7._M_elems[0],in_stack_ffffffffffffe9a0),
             (result_type)in_stack_ffffffffffffe998);
  std::
  vector<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
  ::vector((vector<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
            *)0x1c2ea5);
  std::
  vector<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
  ::vector((vector<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
            *)0x1c2eb2);
  for (local_15b8 = 0; local_15b8 < 0x14; local_15b8 = local_15b8 + 1) {
    for (this_02 = (anon_class_16_2_b8051694 *)0x0; this_02 < (anon_class_16_2_b8051694 *)0x14;
        this_02 = (anon_class_16_2_b8051694 *)((long)&this_02->expectedSortedStorage + 1)) {
      in_stack_ffffffffffffe9a7._M_elems[0] =
           (_Type)shrinkStress<1UL,_1UL,_unsigned_int,_1UL,_20UL,_20UL,_'0',_'1'>::
                  anon_class_8_1_8990f923::operator()(in_stack_ffffffffffffe9e8);
      shrinkStress<1UL,_1UL,_unsigned_int,_1UL,_20UL,_20UL,_'0',_'1'>::anon_class_8_1_8990f923::
      operator()(in_stack_ffffffffffffe9e8);
      supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>::KeyValue
                (this,(array<unsigned_char,_1UL>)SUB81((ulong)this_00 >> 0x38,0),
                 (ByteArray<1UL> *)
                 CONCAT17(in_stack_ffffffffffffe9a7._M_elems[0],in_stack_ffffffffffffe9a0));
      supermap::ByteArray<1UL>::~ByteArray((ByteArray<1UL> *)0x1c2ff9);
      shrinkStress<1UL,_1UL,_unsigned_int,_1UL,_20UL,_20UL,_'0',_'1'>::anon_class_8_1_a0093f41::
      operator()((anon_class_8_1_a0093f41 *)
                 CONCAT17(in_stack_ffffffffffffe9a7._M_elems[0],in_stack_ffffffffffffe9a0),
                 in_stack_ffffffffffffe998);
      supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>::KeyValue
                ((KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_> *)
                 CONCAT17(in_stack_ffffffffffffe9a7._M_elems[0],in_stack_ffffffffffffe9a0),
                 in_stack_ffffffffffffe998);
      supermap::
      OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
      ::appendCopy(this_01,elem);
      supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>::~KeyValue
                ((KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_> *)0x1c3042);
      supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>::~KeyValue
                ((KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_> *)0x1c304f);
    }
    shrinkStress<1UL,_1UL,_unsigned_int,_1UL,_20UL,_20UL,_'0',_'1'>::anon_class_16_2_b8051694::
    operator()(this_02);
    supermap::
    KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_int,_void>::
    shrink(in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc4,in_stack_ffffffffffffedb8);
    shrinkStress<1UL,_1UL,_unsigned_int,_1UL,_20UL,_20UL,_'0',_'1'>::anon_class_8_1_10d00a46::
    operator()(in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88);
    supermap::
    SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
    ::~SortedSingleFileIndexedStorage
              ((SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<1UL>_>
                *)0x1c3226);
    shrinkStress<1UL,_1UL,_unsigned_int,_1UL,_20UL,_20UL,_'0',_'1'>::anon_class_24_3_3cda8c2f::
    operator()(in_stack_ffffffffffffecd0);
    shrinkStress<1UL,_1UL,_unsigned_int,_1UL,_20UL,_20UL,_'0',_'1'>::anon_class_16_2_fd180e1f::
    operator()((anon_class_16_2_fd180e1f *)in_stack_ffffffffffffeaf0);
    shrinkStress<1UL,_1UL,_unsigned_int,_1UL,_20UL,_20UL,_'0',_'1'>::anon_class_16_2_b0a10a34::
    operator()((anon_class_16_2_b0a10a34 *)in_stack_ffffffffffffeaf0);
  }
  std::
  vector<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
  ::~vector((vector<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
             *)this_00);
  std::
  vector<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
  ::~vector((vector<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
             *)this_00);
  supermap::
  KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_int,_void>::
  ~KeyValueShrinkableStorage
            ((KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_int,_void>
              *)CONCAT17(in_stack_ffffffffffffe9a7._M_elems[0],in_stack_ffffffffffffe9a0));
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x1c32c2);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void shrinkStress(std::uint32_t seed) {
    using namespace supermap;
    using K = Key<KeyLen>;
    using V = ByteArray<ValueLen>;
    using KV = KeyValue<Key<KeyLen>, ByteArray<ValueLen>>;
    using KI = KeyValue<K, IndexT>;
    using REG = VoidRegister<KI>;

    const std::string NEW_INDEX_FILENAME = "new-index";

    std::shared_ptr<io::FileManager> manager = std::make_shared<io::DiskFileManager>();
    KeyValueShrinkableStorage<K, V, IndexT, void> storage(
        "keys-not-sorted",
        "keys-sorted",
        manager,
        []() { return std::make_unique<REG>(); }
    );

    std::mt19937 rand(seed);

    auto randValue = [&]() {
        std::string v;
        for (std::size_t i = 0; i < ValueLen; ++i) {
            v += static_cast<char>(rand() % (AlphabetEnd - AlphabetBegin + 1) + AlphabetBegin);
        }
        return V::fromString(v);
    };
    auto randKey = [&]() {
        std::string k;
        for (std::size_t i = 0; i < KeyLen; ++i) {
            k += static_cast<char>(rand() % (AlphabetEnd - AlphabetBegin + 1) + AlphabetBegin);
        }
        return K::fromString(k);
    };

    std::vector<KV> expectedNotSortedStorage;
    std::vector<KV> expectedSortedStorage;

    auto appendToExpected = [&](const KV &kv) {
        expectedNotSortedStorage.push_back(kv);
    };

    auto shrinkExpected = [&]() {
        std::vector<KV> newSorted;
        for (auto sortedIt = expectedSortedStorage.begin(); sortedIt < expectedSortedStorage.end(); ++sortedIt) {
            newSorted.push_back(std::move(*sortedIt));
        }
        for (auto notSortedIt = expectedNotSortedStorage.begin(); notSortedIt < expectedNotSortedStorage.end();
             ++notSortedIt) {
            newSorted.push_back(std::move(*notSortedIt));
        }
        auto newSortedEnd = SortedSingleFileIndexedStorage<KV, IndexT, REG, K>::sortedEndIterator(
            newSorted.begin(),
            newSorted.end(),
            [](const KV &a, const KV &b) { return a.key < b.key; },
            [](const KV &a, const KV &b) { return a.key == b.key; }
        );
        expectedNotSortedStorage = {};
        expectedSortedStorage = {};
        for (auto it = newSorted.begin(); it < newSortedEnd; ++it) {
            expectedSortedStorage.push_back(std::move(*it));
        }
    };

    auto checkNotSorted = [&]() {
        std::vector<KV> actualNotSorted = storage.getNotSortedEntries().collect();
        CHECK_EQ(actualNotSorted.size(), expectedNotSortedStorage.size());
        CHECK_EQ(actualNotSorted, expectedNotSortedStorage);
    };

    auto checkSorted = [&]() {
        std::vector<KV> actualSorted = storage.getSortedEntries().collect();
        auto actualSortedSize = actualSorted.size();
        auto expectedSortedSize = expectedSortedStorage.size();
        CHECK_EQ(actualSortedSize, expectedSortedSize);
        CHECK_EQ(actualSorted, expectedSortedStorage);
    };

    auto checkStorage = [&]() {
        CHECK_EQ(storage.getItemsCount(), expectedSortedStorage.size() + expectedNotSortedStorage.size());
        CHECK_EQ(storage.getNotSortedItemsCount(), expectedNotSortedStorage.size());
        CHECK_EQ(storage.getSortedItemsCount(), expectedSortedStorage.size());
        for (IndexT i = 0; i < expectedSortedStorage.size(); ++i) {
            CHECK_EQ(storage.get(i), expectedSortedStorage[i]);
        }
        for (IndexT i = 0; i < expectedNotSortedStorage.size(); ++i) {
            CHECK_EQ(storage.get(i + expectedSortedStorage.size()), expectedNotSortedStorage[i]);
        }
    };

    auto checkNewIndex = [&](const SortedSingleFileIndexedStorage<KI, IndexT, void, K> &newIndex) {
        auto newIndexSize = newIndex.getItemsCount();
        auto sortedSize = expectedSortedStorage.size();
        CHECK_EQ(newIndexSize, sortedSize);
        for (IndexT i = 0; i < expectedSortedStorage.size(); ++i) {
            IndexT curInd = newIndex.get(i).value;
            K curKey = newIndex.get(i).key;
            K expectedKey = expectedSortedStorage[i].key;
            CHECK_EQ(curInd, i);
            CHECK_EQ(curKey, expectedKey);
        }
    };

    for (std::size_t iter = 0; iter < Iterations; ++iter) {
        for (std::size_t step = 0; step < IterationLen; ++step) {
            KV randKV(randKey(), randValue());
            appendToExpected(randKV);
            storage.appendCopy(randKV);
        }
        shrinkExpected();
        checkNewIndex(storage.shrink(BatchSize, NEW_INDEX_FILENAME));
        checkStorage();
        checkNotSorted();
        checkSorted();
    }
}